

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.cpp
# Opt level: O0

void __thiscall CharScanner::match(CharScanner *this,BitSet *b)

{
  bool bVar1;
  int ch;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  LexerInputState *pLVar3;
  long *in_RDI;
  char *in_stack_ffffffffffffff40;
  BitSet *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  allocator local_71;
  string local_70 [112];
  
  (**(code **)(*in_RDI + 0x90))(in_RDI,1);
  bVar1 = BitSet::member(in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"mismatched char: \'",&local_71);
    ch = (**(code **)(*in_RDI + 0x90))(in_RDI,1);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)charName(ch);
    std::operator+(__lhs,in_stack_ffffffffffffff40);
    std::operator+(__lhs,in_stack_ffffffffffffff40);
    pLVar3 = RefCount<LexerInputState>::operator->((RefCount<LexerInputState> *)(in_RDI + 0xf));
    ScannerException::ScannerException
              ((ScannerException *)CONCAT44(ch,in_stack_ffffffffffffff50),__lhs,
               (int)((ulong)pLVar3 >> 0x20));
    __cxa_throw(uVar2,&ScannerException::typeinfo,ScannerException::~ScannerException);
  }
  (**(code **)(*in_RDI + 0x30))();
  return;
}

Assistant:

void CharScanner::match(const BitSet& b)
{
	if (!b.member(LA(1))) {
		throw ScannerException(std::string("mismatched char: '") + charName(LA(1)) + "'", inputState->line);
	}
	consume();
}